

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O0

void sym_declare(int pass,char *id,char *filename,int line,int column)

{
  sym_t *psVar1;
  int iVar2;
  section_t *psVar3;
  sym_t *psVar4;
  char *pcVar5;
  int in_ECX;
  char *in_RDX;
  char *in_RSI;
  int in_EDI;
  int in_R8D;
  sym_t *new;
  sym_t *psym;
  section_t *sect;
  size_t in_stack_ffffffffffffffc0;
  sym_t *local_30;
  
  if (in_EDI != 2) {
    psVar3 = get_current_section();
    if (psVar3 == (section_t *)0x0) {
      err(F,"symbol declaration before a section has been created");
    }
    else {
      for (local_30 = root; local_30 != (sym_t *)0x0; local_30 = local_30->next) {
        iVar2 = strcmp(local_30->id,in_RSI);
        if (iVar2 == 0) {
          err(E,"redefinition of \'%s\'",in_RSI);
          fprintf(_stderr,"%s:%d:%d: %sprevious definition of \'%s\' was here\n",local_30->filename,
                  (ulong)(uint)local_30->line,(ulong)(uint)local_30->column,"\x1b[36mnote\x1b[0m: ",
                  in_RSI);
          return;
        }
      }
      psVar4 = (sym_t *)mmalloc(in_stack_ffffffffffffffc0);
      psVar1 = psVar4;
      if (root != (sym_t *)0x0) {
        cur->next = psVar4;
        psVar1 = root;
      }
      root = psVar1;
      cur = psVar4;
      strlen(in_RDX);
      pcVar5 = (char *)mmalloc(in_stack_ffffffffffffffc0);
      cur->filename = pcVar5;
      cur->sym_id = num_syms;
      strcpy(cur->id,in_RSI);
      cur->section_id = psVar3->id;
      cur->offset = psVar3->pc;
      cur->type = none;
      strcpy(cur->filename,in_RDX);
      cur->line = in_ECX;
      cur->column = in_R8D;
      cur->next = (sym_s *)0x0;
      num_syms = num_syms + 1;
    }
  }
  return;
}

Assistant:

void sym_declare(int pass, char* id, char* filename, int line, int column)
{
    section_t* sect;
    sym_t* psym;
    sym_t* new;

    if (pass == GEN_PASS)
        return;

    sect = get_current_section();
    if (sect == NULL)
    {
        err(F, "symbol declaration before a section has been created");
        return;
    }

    psym = root;
    while (psym)
    {
        if (strcmp(psym->id, id) == 0)
        {
            err(E, "redefinition of '%s'", id);
            fprintf(stderr,
                "%s:%d:%d: %sprevious definition of '%s' was here\n",
                psym->filename, psym->line, psym->column, notestr, id
                );
            return;
        }
        psym = psym->next;
    }

    new = (sym_t*)mmalloc(sizeof(sym_t));

    if (root == NULL)
    {
        root = new;
        cur = root;
    }
    else
    {
        cur->next = new;
        cur = new;
    }

    cur->filename = (char*)mmalloc(strlen(filename) + 1);

    cur->sym_id = num_syms;
    strcpy(cur->id, id);
    cur->section_id = sect->id;
    cur->offset = sect->pc;
    cur->type = 0;
    strcpy(cur->filename, filename);
    cur->line = line;
    cur->column = column;
    cur->next = NULL;

    ++num_syms;
}